

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O0

int Fraig_NodeVecCompareLevelsDecreasing(Fraig_Node_t **pp1,Fraig_Node_t **pp2)

{
  int iVar1;
  int iVar2;
  int Level2;
  int Level1;
  Fraig_Node_t **pp2_local;
  Fraig_Node_t **pp1_local;
  
  iVar1 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 8);
  iVar2 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 8);
  if (iVar2 < iVar1) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar1 < iVar2) {
    pp1_local._4_4_ = 1;
  }
  else {
    pp1_local._4_4_ = 0;
  }
  return pp1_local._4_4_;
}

Assistant:

int Fraig_NodeVecCompareLevelsDecreasing( Fraig_Node_t ** pp1, Fraig_Node_t ** pp2 )
{
    int Level1 = Fraig_Regular(*pp1)->Level;
    int Level2 = Fraig_Regular(*pp2)->Level;
    if ( Level1 > Level2 )
        return -1;
    if ( Level1 < Level2 )
        return 1;
    return 0; 
}